

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  __node_base *p_Var1;
  size_type *psVar2;
  pointer *pppcVar3;
  pointer __s1;
  size_t size;
  _Hash_node_base *p_Var4;
  __buckets_ptr pp_Var5;
  iterator __position;
  bool bVar6;
  int iVar7;
  char *str;
  LogMessage *other;
  char *pcVar8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var11;
  char *pcVar12;
  ulong uVar13;
  size_type __n;
  ulong uVar14;
  _Hash_node_base _Var15;
  _Hash_node_base *p_Var16;
  size_type len;
  pointer __ptr_1;
  StringPiece SVar17;
  undefined1 auVar18 [16];
  __buckets_alloc_type __alloc;
  LogFinisher local_81;
  _Hash_node_base local_80;
  size_t local_78;
  string *local_70;
  _Hash_node_base *local_68 [7];
  
  __s1 = (full_name->_M_dataplus)._M_p;
  size = full_name->_M_string_length;
  local_80._M_nxt = (_Hash_node_base *)symbol.ptr_;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  SVar17 = Symbol::full_name((Symbol *)&local_80);
  if ((size != SVar17.length_) ||
     ((size != 0 && __s1 != SVar17.ptr_ && (iVar7 = bcmp(__s1,SVar17.ptr_,size), iVar7 != 0)))) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x679);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_68,"CHECK failed: (full_name) == (symbol.full_name()): ")
    ;
    internal::LogFinisher::operator=(&local_81,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
  }
  local_68[0] = local_80._M_nxt;
  SVar17 = Symbol::full_name((Symbol *)local_68);
  pcVar8 = SVar17.ptr_;
  if ((long)SVar17.length_ < 1) {
    p_Var16 = (_Hash_node_base *)0x0;
  }
  else {
    pcVar12 = pcVar8 + SVar17.length_;
    p_Var16 = (_Hash_node_base *)0x0;
    do {
      p_Var16 = (_Hash_node_base *)((long)*pcVar8 + (long)p_Var16 * 5);
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 < pcVar12);
  }
  uVar13 = (ulong)p_Var16 % (this->symbols_by_name_)._M_h._M_bucket_count;
  p_Var9 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (&(this->symbols_by_name_)._M_h,uVar13,(key_type *)&local_80,
                      (__hash_code)p_Var16);
  if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
    local_70 = full_name;
    p_Var10 = (_Hash_node_base *)operator_new(0x18);
    p_Var10->_M_nxt = (_Hash_node_base *)0x0;
    p_Var10[1]._M_nxt = local_80._M_nxt;
    local_78 = (this->symbols_by_name_)._M_h._M_rehash_policy._M_next_resize;
    auVar18 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->symbols_by_name_)._M_h._M_rehash_policy,
                         (this->symbols_by_name_)._M_h._M_bucket_count,
                         (this->symbols_by_name_)._M_h._M_element_count);
    __n = auVar18._8_8_;
    if ((auVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = (this->symbols_by_name_)._M_h._M_buckets;
    }
    else {
      if (__n == 1) {
        __s = &(this->symbols_by_name_)._M_h._M_single_bucket;
        (this->symbols_by_name_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)local_68,__n,(void *)0x0
                        );
        memset(__s,0,__n * 8);
      }
      _Var15._M_nxt = (this->symbols_by_name_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_name_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var15._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(this->symbols_by_name_)._M_h._M_before_begin;
        uVar13 = 0;
        do {
          p_Var4 = (_Var15._M_nxt)->_M_nxt;
          uVar14 = (ulong)_Var15._M_nxt[2]._M_nxt % __n;
          if (__s[uVar14] == (_Hash_node_base *)0x0) {
            (_Var15._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var15._M_nxt;
            __s[uVar14] = p_Var1;
            if ((_Var15._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var11 = __s + uVar13;
              goto LAB_00344948;
            }
          }
          else {
            (_Var15._M_nxt)->_M_nxt = __s[uVar14]->_M_nxt;
            pp_Var11 = &__s[uVar14]->_M_nxt;
            uVar14 = uVar13;
LAB_00344948:
            *pp_Var11 = _Var15._M_nxt;
          }
          _Var15._M_nxt = p_Var4;
          uVar13 = uVar14;
        } while (p_Var4 != (_Hash_node_base *)0x0);
      }
      pp_Var5 = (this->symbols_by_name_)._M_h._M_buckets;
      if (&(this->symbols_by_name_)._M_h._M_single_bucket != pp_Var5) {
        operator_delete(pp_Var5);
      }
      (this->symbols_by_name_)._M_h._M_bucket_count = __n;
      (this->symbols_by_name_)._M_h._M_buckets = __s;
      uVar13 = (ulong)p_Var16 % __n;
    }
    p_Var10[2]._M_nxt = p_Var16;
    if (__s[uVar13] == (_Hash_node_base *)0x0) {
      p_Var16 = (this->symbols_by_name_)._M_h._M_before_begin._M_nxt;
      p_Var10->_M_nxt = p_Var16;
      (this->symbols_by_name_)._M_h._M_before_begin._M_nxt = p_Var10;
      if (p_Var16 != (_Hash_node_base *)0x0) {
        __s[(ulong)p_Var16[2]._M_nxt % (this->symbols_by_name_)._M_h._M_bucket_count] = p_Var10;
        __s = (this->symbols_by_name_)._M_h._M_buckets;
      }
      __s[uVar13] = &(this->symbols_by_name_)._M_h._M_before_begin;
    }
    else {
      p_Var10->_M_nxt = __s[uVar13]->_M_nxt;
      __s[uVar13]->_M_nxt = p_Var10;
    }
    psVar2 = &(this->symbols_by_name_)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    local_68[0] = (_Hash_node_base *)(local_70->_M_dataplus)._M_p;
    __position._M_current =
         (this->symbols_after_checkpoint_).
         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->symbols_after_checkpoint_).
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&this->symbols_after_checkpoint_
                 ,__position,(char **)local_68);
    }
    else {
      *__position._M_current = (char *)local_68[0];
      pppcVar3 = &(this->symbols_after_checkpoint_).
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar3 = *pppcVar3 + 1;
    }
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(const std::string& full_name,
                                       Symbol symbol) {
  GOOGLE_DCHECK_EQ(full_name, symbol.full_name());
  if (symbols_by_name_.insert(symbol).second) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}